

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

HashElem * findElementGivenHash(Hash *pH,char *pKey,int nKey,uint h)

{
  int iVar1;
  Hash *pHVar2;
  Hash *pHVar3;
  uint uVar4;
  HashElem *pHVar5;
  bool bVar6;
  
  pHVar2 = (Hash *)(pH->ht + h);
  pHVar3 = (Hash *)&pH->count;
  if (pH->ht != (_ht *)0x0) {
    pHVar3 = pHVar2;
    pH = pHVar2;
  }
  uVar4 = pHVar3->htsize;
  pHVar5 = (HashElem *)&pH->first;
  while( true ) {
    bVar6 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar6) {
      return (HashElem *)0x0;
    }
    pHVar5 = pHVar5->next;
    if (pHVar5 == (HashElem *)0x0) break;
    if ((pHVar5->nKey == nKey) && (iVar1 = sqlite3_strnicmp(pHVar5->pKey,pKey,nKey), iVar1 == 0)) {
      return pHVar5;
    }
  }
  return (HashElem *)0x0;
}

Assistant:

static HashElem *findElementGivenHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  int nKey,           /* Bytes in key (not counting zero terminator) */
  unsigned int h      /* The hash for this key. */
){
  HashElem *elem;                /* Used to loop thru the element list */
  int count;                     /* Number of elements left to test */

  if( pH->ht ){
    struct _ht *pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    elem = pH->first;
    count = pH->count;
  }
  while( count-- && ALWAYS(elem) ){
    if( elem->nKey==nKey && sqlite3StrNICmp(elem->pKey,pKey,nKey)==0 ){ 
      return elem;
    }
    elem = elem->next;
  }
  return 0;
}